

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

bool __thiscall
QGraphicsViewPrivate::updateRegion(QGraphicsViewPrivate *this,QRectF *rect,QTransform *xform)

{
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  QRect QVar4;
  QRect QVar5;
  QRect QVar6;
  uint uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  bool bVar10;
  long lVar11;
  uint uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  QRect QVar17;
  undefined1 auVar18 [16];
  QRegion region;
  QRegion local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  double local_58;
  double local_50;
  undefined1 *local_48;
  long lStack_40;
  long local_38;
  
  QVar5._8_8_ = uStack_60;
  QVar5._0_8_ = local_68;
  QVar4._8_8_ = uStack_60;
  QVar4._0_8_ = local_68;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = false;
  if ((0.0 < rect->w) && (bVar10 = false, QVar4 = QVar5, 0.0 < rect->h)) {
    if (this->viewportUpdateMode - MinimalViewportUpdate < 2) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      _local_68 = (QRect)QRectF::toAlignedRect();
      QRegion::QRegion(&local_70,(QRect *)local_68,Rectangle);
      QTransform::map((QRegion *)&local_48);
      QRegion::~QRegion(&local_70);
      auVar16 = QRegion::boundingRect();
      uVar7 = (this->optimizationFlags).
              super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
              super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i;
      uVar12 = uVar7 & 2;
      lVar11 = 0x200000000;
      if (uVar12 != 0) {
        lVar11 = 0x100000000;
      }
      pQVar1 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      bVar2 = (int)((-(uint)(uVar12 != 0) | 0xfffffffe) + auVar16._0_4_) <=
              ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
      bVar13 = -1 < (int)((uint)(uVar12 == 0) + auVar16._8_4_ + 1);
      bVar3 = (int)((((ulong)(uVar7 >> 1) | 0xfffffffffffffffe) << 0x20) + auVar16._0_8_ >> 0x20) <
              ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
      bVar14 = -1 < lVar11 + auVar16._8_8_;
      bVar10 = (bVar14 && bVar2) && (bVar3 && bVar13);
      if ((bVar14 && bVar2) && (bVar3 && bVar13)) {
        puVar8 = (undefined8 *)QRegion::begin();
        puVar9 = (undefined8 *)QRegion::end();
        if (puVar8 != puVar9) {
          uVar7 = (uint)((uVar7 & 2) == 0);
          uVar12 = (int)(uVar7 << 0x1f) >> 0x1f;
          uVar15 = (int)(uVar7 << 0x1f) >> 0x1f;
          uVar7 = uVar12 & 0xfffffffe | ~uVar12;
          uVar12 = uVar15 & 2 | ~uVar15 & 1;
          do {
            local_68._0_4_ = (undefined4)*puVar8;
            local_68._4_4_ = (undefined4)((ulong)*puVar8 >> 0x20);
            uStack_60._0_4_ = (int)puVar8[1];
            uStack_60._4_4_ = (int)((ulong)puVar8[1] >> 0x20);
            local_68._0_4_ = local_68._0_4_ + uVar7;
            local_68._4_4_ = local_68._4_4_ + uVar7;
            uStack_60 = (qreal)CONCAT44(uStack_60._4_4_ + uVar12,uStack_60._0_4_ + uVar12);
            QVar17._8_8_ = uStack_60;
            QVar17.x1.m_i = local_68._0_4_;
            QVar17.y1.m_i = local_68._4_4_;
            if ((this->field_0x301 & 0x20) != 0) {
              QVar17 = (QRect)QRect::operator&((QRect *)local_68,&this->updateClip);
            }
            _local_68 = QVar17;
            QRegion::operator+=(&this->dirtyRegion,(QRect *)local_68);
            puVar8 = puVar8 + 2;
          } while (puVar8 != puVar9);
        }
      }
      QRegion::~QRegion((QRegion *)&local_48);
      QVar4 = _local_68;
    }
    else {
      QTransform::mapRect((QRectF *)local_68);
      QVar6._8_8_ = uStack_60;
      QVar6.x1.m_i = local_68._0_4_;
      QVar6.y1.m_i = local_68._4_4_;
      QVar4._8_8_ = uStack_60;
      QVar4.x1.m_i = local_68._0_4_;
      QVar4.y1.m_i = local_68._4_4_;
      bVar10 = false;
      if ((0.0 < local_58) && (QVar4 = QVar6, 0.0 < local_50)) {
        if (((this->optimizationFlags).super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>
             .super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
          auVar16 = QRectF::toAlignedRect();
          auVar18._12_4_ = auVar16._12_4_;
          auVar18._0_4_ = (undefined4)(auVar16._0_8_ + 0xfffffffe);
          auVar18._8_4_ = (undefined4)(auVar16._8_8_ + 2);
          auVar18._4_4_ = auVar18._8_4_;
          local_48 = (undefined1 *)(CONCAT44(auVar16._4_4_,auVar18._0_4_) + -0x200000000);
          lStack_40 = auVar18._8_8_ + 0x200000000;
        }
        else {
          auVar18 = QRectF::toAlignedRect();
          auVar16._12_4_ = auVar18._12_4_;
          auVar16._0_4_ = (undefined4)(auVar18._0_8_ + 0xffffffff);
          auVar16._8_4_ = (undefined4)(auVar18._8_8_ + 1);
          auVar16._4_4_ = auVar16._8_4_;
          local_48 = (undefined1 *)(CONCAT44(auVar18._4_4_,auVar16._0_4_) + -0x100000000);
          lStack_40 = auVar16._8_8_ + 0x100000000;
        }
        bVar10 = updateRect(this,(QRect *)&local_48);
        QVar4._8_8_ = uStack_60;
        QVar4.x1.m_i = local_68._0_4_;
        QVar4.y1.m_i = local_68._4_4_;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  _local_68 = QVar4;
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::updateRegion(const QRectF &rect, const QTransform &xform)
{
    if (rect.isEmpty())
        return false;

    if (viewportUpdateMode != QGraphicsView::MinimalViewportUpdate
        && viewportUpdateMode != QGraphicsView::SmartViewportUpdate) {
        // No point in updating with QRegion granularity; use the rect instead.
        return updateRectF(xform.mapRect(rect));
    }

    // Update mode is either Minimal or Smart, so we have to do a potentially slow operation,
    // which is clearly documented here: QGraphicsItem::setBoundingRegionGranularity.
    const QRegion region = xform.map(QRegion(rect.toAlignedRect()));
    QRect viewRect = region.boundingRect();
    const bool dontAdjustForAntialiasing = optimizationFlags & QGraphicsView::DontAdjustForAntialiasing;
    if (dontAdjustForAntialiasing)
        viewRect.adjust(-1, -1, 1, 1);
    else
        viewRect.adjust(-2, -2, 2, 2);
    if (!intersectsViewport(viewRect, viewport->width(), viewport->height()))
        return false; // Update region for sure outside viewport.

    for (QRect viewRect : region) {
        if (dontAdjustForAntialiasing)
            viewRect.adjust(-1, -1, 1, 1);
        else
            viewRect.adjust(-2, -2, 2, 2);
        if (hasUpdateClip)
            viewRect &= updateClip;
        dirtyRegion += viewRect;
    }

    return true;
}